

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O3

lua_Unsigned luaH_getn(Table *t)

{
  int *piVar1;
  Value *pVVar2;
  TValue *pTVar3;
  ulong uVar4;
  lua_Unsigned lVar5;
  uint uVar6;
  uint uVar7;
  lua_Unsigned lVar8;
  ulong uVar9;
  uint uVar10;
  byte *pbVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  bool bVar15;
  
  uVar6 = t->asize;
  uVar9 = (ulong)uVar6;
  if (uVar9 != 0) {
    pVVar2 = t->array;
    uVar7 = *(uint *)pVVar2;
    uVar12 = 1;
    if (1 < uVar7) {
      uVar12 = uVar7;
    }
    if ((*(byte *)((long)pVVar2 + (ulong)(uVar12 - 1) + 4) & 0xf) == 0) {
      uVar10 = 0;
      if (1 < uVar7) {
        uVar6 = 3;
        if (uVar12 - 2 < 3) {
          uVar6 = uVar12 - 2;
        }
        pbVar11 = (byte *)((long)pVVar2 + (ulong)uVar7 + 2);
        iVar13 = uVar6 + 1;
        uVar12 = -uVar12;
        do {
          if ((*pbVar11 & 0xf) != 0) {
            *(uint *)pVVar2 = ~uVar12;
            return (ulong)~uVar12;
          }
          pbVar11 = pbVar11 + -1;
          uVar12 = uVar12 + 1;
          iVar13 = iVar13 + -1;
        } while (iVar13 != 0);
        uVar12 = -uVar12;
        if (1 < uVar12) {
          uVar10 = 0;
          do {
            uVar6 = uVar12 + uVar10 >> 1;
            if ((*(byte *)((long)pVVar2 + (ulong)(uVar6 - 1) + 4) & 0xf) == 0) {
              uVar12 = uVar6;
              uVar6 = uVar10;
            }
            uVar10 = uVar6;
          } while (1 < uVar12 - uVar10);
        }
      }
LAB_0011cf9e:
      *(uint *)pVVar2 = uVar10;
      return (ulong)uVar10;
    }
    if (uVar12 < uVar6) {
      lVar5 = 1;
      if (1 < uVar7) {
        lVar5 = (lua_Unsigned)uVar7;
      }
      lVar8 = lVar5;
      uVar7 = 0;
      do {
        if ((*(byte *)((long)pVVar2 + lVar8 + 4) & 0xf) == 0) {
          *(uint *)pVVar2 = (int)lVar5 + uVar7;
          return lVar8;
        }
        lVar8 = lVar8 + 1;
        uVar12 = uVar7 + 1;
      } while ((lVar8 < uVar9) && (bVar15 = uVar7 < 3, uVar7 = uVar12, bVar15));
      uVar12 = (int)lVar5 + uVar12;
    }
    if ((*(byte *)((long)pVVar2 + (ulong)(uVar6 - 1) + 4) & 0xf) == 0) {
      uVar6 = uVar6 - uVar12;
      uVar10 = uVar12;
      while (1 < uVar6) {
        uVar7 = (int)uVar9 + uVar10 >> 1;
        if ((*(byte *)((long)pVVar2 + (ulong)(uVar7 - 1) + 4) & 0xf) == 0) {
          uVar9 = (ulong)uVar7;
          uVar7 = uVar10;
        }
        uVar10 = uVar7;
        uVar6 = (int)uVar9 - uVar7;
      }
      goto LAB_0011cf9e;
    }
    *(uint *)pVVar2 = uVar6;
  }
  if ((t->flags & 0x40) != 0) {
    return uVar9;
  }
  pTVar3 = getintfromhash(t,(ulong)(uVar6 + 1));
  if ((pTVar3->tt_ & 0xf) == 0) {
    return uVar9;
  }
  uVar9 = (ulong)(uVar6 + (uVar6 == 0));
  do {
    lVar5 = uVar9;
    if (lVar5 >> 0x3e != 0) {
      uVar9 = 0x7fffffffffffffff;
      pTVar3 = (TValue *)
               (t->node +
               SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) %
                      ZEXT416(~(-1 << (t->lsizenode & 0x1f)) | 1),0));
      goto LAB_0011cf28;
    }
    uVar9 = lVar5 * 2;
    pTVar3 = getintfromhash(t,uVar9);
  } while ((pTVar3->tt_ & 0xf) != 0);
  goto LAB_0011cf4e;
  while (piVar1 = &((NodeKey *)pTVar3)->next,
        pTVar3 = (TValue *)((long)pTVar3 + (long)*piVar1 * 0x18), (long)*piVar1 != 0) {
LAB_0011cf28:
    if ((((NodeKey *)pTVar3)->key_tt == '\x03') &&
       ((((NodeKey *)pTVar3)->key_val).gc == (GCObject *)0x7fffffffffffffff)) goto LAB_0011cf48;
  }
  pTVar3 = &absentkey;
LAB_0011cf48:
  if ((((NodeKey *)pTVar3)->tt_ & 0xf) != 0) {
    return 0x7fffffffffffffff;
  }
LAB_0011cf4e:
  uVar4 = uVar9 - lVar5;
  while (1 < uVar4) {
    uVar4 = uVar9 + lVar5 >> 1;
    pTVar3 = getintfromhash(t,uVar4);
    uVar14 = uVar4;
    if ((pTVar3->tt_ & 0xf) != 0) {
      uVar14 = uVar9;
      lVar5 = uVar4;
    }
    uVar9 = uVar14;
    uVar4 = uVar14 - lVar5;
  }
  return lVar5;
}

Assistant:

lua_Unsigned luaH_getn (Table *t) {
  unsigned asize = t->asize;
  if (asize > 0) {  /* is there an array part? */
    const unsigned maxvicinity = 4;
    unsigned limit = *lenhint(t);  /* start with the hint */
    if (limit == 0)
      limit = 1;  /* make limit a valid index in the array */
    if (arraykeyisempty(t, limit)) {  /* t[limit] empty? */
      /* there must be a border before 'limit' */
      unsigned i;
      /* look for a border in the vicinity of the hint */
      for (i = 0; i < maxvicinity && limit > 1; i++) {
        limit--;
        if (!arraykeyisempty(t, limit))
          return newhint(t, limit);  /* 'limit' is a border */
      }
      /* t[limit] still empty; search for a border in [0, limit) */
      return newhint(t, binsearch(t, 0, limit));
    }
    else {  /* 'limit' is present in table; look for a border after it */
      unsigned i;
      /* look for a border in the vicinity of the hint */
      for (i = 0; i < maxvicinity && limit < asize; i++) {
        limit++;
        if (arraykeyisempty(t, limit))
          return newhint(t, limit - 1);  /* 'limit - 1' is a border */
      }
      if (arraykeyisempty(t, asize)) {  /* last element empty? */
        /* t[limit] not empty; search for a border in [limit, asize) */
        return newhint(t, binsearch(t, limit, asize));
      }
    }
    /* last element non empty; set a hint to speed up finding that again */
    /* (keys in the hash part cannot be hints) */
    *lenhint(t) = asize;
  }
  /* no array part or t[asize] is not empty; check the hash part */
  lua_assert(asize == 0 || !arraykeyisempty(t, asize));
  if (isdummy(t) || hashkeyisempty(t, asize + 1))
    return asize;  /* 'asize + 1' is empty */
  else  /* 'asize + 1' is also non empty */
    return hash_search(t, asize);
}